

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnconditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::TokenList&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,TokenList *args_2)

{
  Token directive;
  UnconditionalBranchDirectiveSyntax *pUVar1;
  TokenList *in_RCX;
  BumpAllocator *in_RDX;
  UnconditionalBranchDirectiveSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pUVar1 = (UnconditionalBranchDirectiveSyntax *)
           allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  directive.info = unaff_retaddr;
  directive.kind = (short)in_RDI;
  directive._2_1_ = (char)((ulong)in_RDI >> 0x10);
  directive.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  directive.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::UnconditionalBranchDirectiveSyntax::UnconditionalBranchDirectiveSyntax
            (in_RSI,(SyntaxKind)((ulong)in_RDX >> 0x20),directive,in_RCX);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }